

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventReportReliablePdu.cpp
# Opt level: O2

void __thiscall DIS::EventReportReliablePdu::~EventReportReliablePdu(EventReportReliablePdu *this)

{
  (this->super_SimulationManagementWithReliabilityFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__EventReportReliablePdu_001b0fb8;
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::clear(&this->_fixedDatumRecords);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::clear
            (&this->_variableDatumRecords);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::~vector
            (&this->_variableDatumRecords);
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::~vector(&this->_fixedDatumRecords)
  ;
  SimulationManagementWithReliabilityFamilyPdu::~SimulationManagementWithReliabilityFamilyPdu
            (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  return;
}

Assistant:

EventReportReliablePdu::~EventReportReliablePdu()
{
    _fixedDatumRecords.clear();
    _variableDatumRecords.clear();
}